

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_objects.hh
# Opt level: O1

intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::refzg::path::node_t,_tchecker::refzg::path::edge_t>,_unsigned_long,_1UL>_>
* __thiscall
tchecker::
intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::refzg::path::node_t,_tchecker::refzg::path::edge_t>,_unsigned_long,_1UL>_>
::operator=(intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::refzg::path::node_t,_tchecker::refzg::path::edge_t>,_unsigned_long,_1UL>_>
            *this,intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::refzg::path::node_t,_tchecker::refzg::path::edge_t>,_unsigned_long,_1UL>_>
                  *p)

{
  make_shared_t<tchecker::graph::reachability::edge_t<tchecker::refzg::path::node_t,_tchecker::refzg::path::edge_t>,_unsigned_long,_1UL>
  *pmVar1;
  make_shared_t<tchecker::graph::reachability::node_t<tchecker::refzg::path::node_t,_tchecker::refzg::path::edge_t>,_unsigned_long,_1UL>
  *pmVar2;
  underflow_error *this_00;
  
  if (this != p) {
    reset(this,p->_t);
    pmVar1 = p->_t;
    if (pmVar1 != (make_shared_t<tchecker::graph::reachability::edge_t<tchecker::refzg::path::node_t,_tchecker::refzg::path::edge_t>,_unsigned_long,_1UL>
                   *)0x0) {
      pmVar2 = pmVar1[-1].super_edge_t<tchecker::refzg::path::node_t,_tchecker::refzg::path::edge_t>
               .
               super_edge_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::refzg::path::node_t,_tchecker::refzg::path::edge_t>,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::refzg::path::node_t,_tchecker::refzg::path::edge_t>,_unsigned_long,_1UL>_>_>
               .
               super_edge_node_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::refzg::path::node_t,_tchecker::refzg::path::edge_t>,_unsigned_long,_1UL>_>_>
               ._node._t;
      if (pmVar2 == (make_shared_t<tchecker::graph::reachability::node_t<tchecker::refzg::path::node_t,_tchecker::refzg::path::edge_t>,_unsigned_long,_1UL>
                     *)0x0) {
        this_00 = (underflow_error *)__cxa_allocate_exception(0x10);
        std::underflow_error::underflow_error(this_00,"reference counter underflow");
        __cxa_throw(this_00,&std::underflow_error::typeinfo,std::underflow_error::~underflow_error);
      }
      pmVar1[-1].super_edge_t<tchecker::refzg::path::node_t,_tchecker::refzg::path::edge_t>.
      super_edge_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::refzg::path::node_t,_tchecker::refzg::path::edge_t>,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::refzg::path::node_t,_tchecker::refzg::path::edge_t>,_unsigned_long,_1UL>_>_>
      .
      super_edge_node_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::refzg::path::node_t,_tchecker::refzg::path::edge_t>,_unsigned_long,_1UL>_>_>
      ._node._t = (make_shared_t<tchecker::graph::reachability::node_t<tchecker::refzg::path::node_t,_tchecker::refzg::path::edge_t>,_unsigned_long,_1UL>
                   *)((long)&pmVar2[-1].
                             super_node_t<tchecker::refzg::path::node_t,_tchecker::refzg::path::edge_t>
                             .
                             super_node_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::refzg::path::node_t,_tchecker::refzg::path::edge_t>,_unsigned_long,_1UL>_>_>
                             .
                             super_edge_list_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::refzg::path::node_t,_tchecker::refzg::path::edge_t>,_unsigned_long,_1UL>_>_>
                             ._head._t + 7);
    }
    p->_t = (make_shared_t<tchecker::graph::reachability::edge_t<tchecker::refzg::path::node_t,_tchecker::refzg::path::edge_t>,_unsigned_long,_1UL>
             *)0x0;
  }
  return this;
}

Assistant:

tchecker::intrusive_shared_ptr_t<T> & operator=(tchecker::intrusive_shared_ptr_t<T> && p)
  {
    if (this != &p) {
      reset(p._t);
      p.reset(nullptr);
    }
    return *this;
  }